

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void BotTest<generic_bots::MinimaxBot<ttt::Board,minimax::ABeta<ttt::Board,minimax::Eval<ttt::Board>>>,ttt::Board>
               (void)

{
  ostream *poVar1;
  int iVar2;
  MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_> bot;
  Board game;
  char local_59;
  MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_> local_58;
  Board local_3a;
  
  ttt::Board::Board(&local_3a);
  iVar2 = 1;
  do {
    local_58.super_IBot<ttt::Board>._vptr_IBot = (_func_int **)&PTR__IBot_00161588;
    local_58.super_IBot<ttt::Board>.game = (Board *)operator_new(10);
    *(undefined8 *)((local_58.super_IBot<ttt::Board>.game)->board)._M_elems =
         local_3a.board._M_elems._0_8_;
    *(undefined2 *)(((local_58.super_IBot<ttt::Board>.game)->board)._M_elems[2]._M_elems + 2) =
         local_3a._8_2_;
    local_58.super_IBot<ttt::Board>._vptr_IBot = (_func_int **)&PTR__IBot_001615c0;
    local_58.depth = iVar2;
    std::chrono::_V2::system_clock::now();
    generic_bots::MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_>::
    MakeMove(&local_58);
    std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Depth: ",7);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," in ",4);
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," milliseconds\n",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Move: ",6);
    poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
    local_59 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_59,1);
    local_58.super_IBot<ttt::Board>._vptr_IBot = (_func_int **)&PTR__IBot_00161588;
    if (local_58.super_IBot<ttt::Board>.game != (Board *)0x0) {
      operator_delete(local_58.super_IBot<ttt::Board>.game);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0xd);
  return;
}

Assistant:

void
BotTest()
{
    IGame game;
    for (int i = 1; i < 13; ++i)
    {
        IBot bot(&game, i);
        auto t1 = std::chrono::high_resolution_clock::now();
        auto m = bot.MakeMove();
        auto t2 = std::chrono::high_resolution_clock::now();
        auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        std::cout << "Depth: " << i << " in " << millis << " milliseconds\n";
        std::cout << "Move: " << m << '\n';
    }
}